

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O0

bool __thiscall
iDynTree::Model::updateInertialParameters(Model *this,VectorDynSize *modelInertialParams)

{
  long start;
  size_t sVar1;
  Map<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0,_Eigen::Stride<0,_0>_> *pMVar2;
  reference this_00;
  SpatialInertia *pSVar3;
  Index in_RDI;
  Vector10 inertiaParamsBuf;
  LinkIndex linkIdx;
  DenseBase<Eigen::Block<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>,_10,_1,_false>_>
  *in_stack_ffffffffffffff08;
  Map<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0,_Eigen::Stride<0,_0>_> *this_01;
  VectorDynSize *in_stack_ffffffffffffff28;
  VectorFixSize<10U> local_70;
  Map<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0,_Eigen::Stride<0,_0>_> *local_20;
  bool local_1;
  
  start = iDynTree::VectorDynSize::size();
  sVar1 = getNrOfLinks((Model *)0x44b930);
  if (start == sVar1 * 10) {
    local_20 = (Map<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0,_Eigen::Stride<0,_0>_> *)0x0;
    while( true ) {
      this_01 = local_20;
      pMVar2 = (Map<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0,_Eigen::Stride<0,_0>_> *)
               getNrOfLinks((Model *)0x44b98b);
      if (pMVar2 <= this_01) break;
      VectorFixSize<10U>::VectorFixSize(&local_70);
      toEigen(in_stack_ffffffffffffff28);
      Eigen::
      DenseBase<Eigen::Map<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>
      ::segment<10>((DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                     *)in_stack_ffffffffffffff28,start,in_RDI);
      toEigen<10U>((VectorFixSize<10U> *)in_stack_ffffffffffffff28);
      Eigen::Map<Eigen::Matrix<double,10,1,0,10,1>,0,Eigen::Stride<0,0>>::operator=
                (this_01,in_stack_ffffffffffffff08);
      this_00 = std::vector<iDynTree::Link,_std::allocator<iDynTree::Link>_>::operator[]
                          ((vector<iDynTree::Link,_std::allocator<iDynTree::Link>_> *)(in_RDI + 8),
                           (size_type)local_20);
      pSVar3 = Link::inertia(this_00);
      iDynTree::SpatialInertia::fromVector((VectorFixSize *)pSVar3);
      local_20 = (Map<Eigen::Matrix<double,_10,_1,_0,_10,_1>,_0,_Eigen::Stride<0,_0>_> *)
                 &local_20->field_0x1;
    }
    local_1 = true;
  }
  else {
    iDynTree::reportError
              ("Model","updateInertialParameters",
               "modelInertialParams has the wrong number of parameters");
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Model::updateInertialParameters(const VectorDynSize& modelInertialParams)
{
    if( modelInertialParams.size() != this->getNrOfLinks()*10 )
    {
        reportError("Model","updateInertialParameters","modelInertialParams has the wrong number of parameters");
        return false;
    }

    for(LinkIndex linkIdx = 0; linkIdx < this->getNrOfLinks(); linkIdx++ )
    {
        Vector10       inertiaParamsBuf;
        toEigen(inertiaParamsBuf) = toEigen(modelInertialParams).segment<10>(10*linkIdx);

        links[linkIdx].inertia().fromVector(inertiaParamsBuf);
    }

    return true;
}